

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.hpp
# Opt level: O3

return_type __thiscall
asio::io_context::
post<asio::detail::wrapped_handler<asio::io_context::strand,std::function<void()>,asio::detail::is_continuation_if_running>>
          (io_context *this,
          wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>
          *handler)

{
  implementation_type psVar1;
  long *plVar2;
  undefined8 uVar3;
  long in_FS_OFFSET;
  bool is_continuation;
  ptr local_30;
  
  plVar2 = *(long **)(in_FS_OFFSET + -8);
  if (plVar2 != (long *)0x0) {
    do {
      if ((implementation_type)*plVar2 == (handler->dispatcher_).impl_) {
        is_continuation = plVar2[1] != 0;
        goto LAB_00185db1;
      }
      plVar2 = (long *)plVar2[2];
    } while (plVar2 != (long *)0x0);
  }
  is_continuation = false;
LAB_00185db1:
  if (*(long *)(in_FS_OFFSET + -0x10) == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(undefined8 *)(*(long *)(in_FS_OFFSET + -0x10) + 8);
  }
  local_30.h = handler;
  local_30.v = (completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
                *)detail::thread_info_base::allocate<asio::detail::thread_info_base::default_tag>
                            (uVar3,0x48);
  ((local_30.v)->super_operation).next_ = (scheduler_operation *)0x0;
  ((local_30.v)->super_operation).func_ =
       detail::
       completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
       ::do_complete;
  ((local_30.v)->super_operation).task_result_ = 0;
  psVar1 = (handler->dispatcher_).impl_;
  ((local_30.v)->handler_).dispatcher_.service_ = (handler->dispatcher_).service_;
  ((local_30.v)->handler_).dispatcher_.impl_ = psVar1;
  ((local_30.v)->handler_).handler_.super__Function_base._M_manager = (_Manager_type)0x0;
  ((local_30.v)->handler_).handler_.super__Function_base._M_functor =
       (_Any_data)(ZEXT816(0) << 0x20);
  ((local_30.v)->handler_).handler_._M_invoker = (handler->handler_)._M_invoker;
  if ((handler->handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar3 = *(undefined8 *)((long)&(handler->handler_).super__Function_base._M_functor + 8);
    *(undefined8 *)&((local_30.v)->handler_).handler_.super__Function_base._M_functor =
         *(undefined8 *)&(handler->handler_).super__Function_base._M_functor;
    *(undefined8 *)((long)&((local_30.v)->handler_).handler_.super__Function_base._M_functor + 8) =
         uVar3;
    ((local_30.v)->handler_).handler_.super__Function_base._M_manager =
         (handler->handler_).super__Function_base._M_manager;
    *(undefined1 (*) [16])&(handler->handler_).super__Function_base._M_manager = ZEXT816(0) << 0x20;
  }
  local_30.p = local_30.v;
  detail::scheduler::post_immediate_completion(this->impl_,(operation *)local_30.v,is_continuation);
  local_30.v = (completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
                *)0x0;
  local_30.p = (completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
                *)0x0;
  detail::
  completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
  ::ptr::reset(&local_30);
  return;
}

Assistant:

io_context::post(ASIO_MOVE_ARG(LegacyCompletionHandler) handler)
{
  // If you get an error on the following line it means that your handler does
  // not meet the documented type requirements for a LegacyCompletionHandler.
  ASIO_LEGACY_COMPLETION_HANDLER_CHECK(
      LegacyCompletionHandler, handler) type_check;

  async_completion<LegacyCompletionHandler, void ()> init(handler);

  bool is_continuation =
    asio_handler_cont_helpers::is_continuation(init.completion_handler);

  // Allocate and construct an operation to wrap the handler.
  typedef detail::completion_handler<
    typename handler_type<LegacyCompletionHandler, void ()>::type> op;
  typename op::ptr p = { detail::addressof(init.completion_handler),
      op::ptr::allocate(init.completion_handler), 0 };
  p.p = new (p.v) op(init.completion_handler);

  ASIO_HANDLER_CREATION((*this, *p.p,
        "io_context", this, 0, "post"));

  impl_.post_immediate_completion(p.p, is_continuation);
  p.v = p.p = 0;

  return init.result.get();
}